

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 GenStateProcessArgValue(jx9_gen_state *pGen,jx9_vm_func_arg *pArg,SyToken *pIn,SyToken *pEnd)

{
  SyToken *pSVar1;
  SyToken *pSVar2;
  sxi32 sVar3;
  SySet *pContainer;
  sxi32 rc;
  SySet *pInstrContainer;
  SyToken *pTmpEnd;
  SyToken *pTmpIn;
  SyToken *pEnd_local;
  SyToken *pIn_local;
  jx9_vm_func_arg *pArg_local;
  jx9_gen_state *pGen_local;
  
  pSVar1 = pGen->pIn;
  pSVar2 = pGen->pEnd;
  pGen->pIn = pIn;
  pGen->pEnd = pEnd;
  pContainer = jx9VmGetByteCodeContainer(pGen->pVm);
  jx9VmSetByteCodeContainer(pGen->pVm,&pArg->aByteCode);
  sVar3 = jx9CompileExpr(pGen,0,(_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0);
  jx9VmEmitInstr(pGen->pVm,1,(uint)(sVar3 != -3),0,(void *)0x0,(sxu32 *)0x0);
  jx9VmSetByteCodeContainer(pGen->pVm,pContainer);
  pGen->pIn = pSVar1;
  pGen->pEnd = pSVar2;
  if (sVar3 == -10) {
    pGen_local._4_4_ = -10;
  }
  else {
    pGen_local._4_4_ = 0;
  }
  return pGen_local._4_4_;
}

Assistant:

static sxi32 GenStateProcessArgValue(jx9_gen_state *pGen, jx9_vm_func_arg *pArg, SyToken *pIn, SyToken *pEnd)
{
	SyToken *pTmpIn, *pTmpEnd;
	SySet *pInstrContainer;
	sxi32 rc;
	/* Swap token stream */
	SWAP_DELIMITER(pGen, pIn, pEnd);
	pInstrContainer = jx9VmGetByteCodeContainer(pGen->pVm);
	jx9VmSetByteCodeContainer(pGen->pVm, &pArg->aByteCode);
	/* Compile the expression holding the argument value */
	rc = jx9CompileExpr(&(*pGen), 0, 0);
	/* Emit the done instruction */
	jx9VmEmitInstr(pGen->pVm, JX9_OP_DONE, (rc != SXERR_EMPTY ? 1 : 0), 0, 0, 0);
	jx9VmSetByteCodeContainer(pGen->pVm, pInstrContainer); 
	RE_SWAP_DELIMITER(pGen);
	if( rc == SXERR_ABORT ){
		return SXERR_ABORT;
	}
	return SXRET_OK;
}